

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void __thiscall ExpressionContext::HideFunction(ExpressionContext *this,FunctionData *function)

{
  ScopeData *pSVar1;
  FunctionData *pFVar2;
  uint uVar3;
  SmallArray<FunctionData_*,_2U> *this_00;
  FunctionData **ppFVar4;
  uint local_44;
  uint i;
  SmallArray<FunctionData_*,_2U> *scopeFunctions;
  IdentifierLookupResult local_28;
  FunctionData *local_18;
  FunctionData *function_local;
  ExpressionContext *this_local;
  
  local_18 = function;
  function_local = (FunctionData *)this;
  if (((function->name->name).begin != (char *)0x0) && (*(function->name->name).begin != '$')) {
    if ((this->scope->type == SCOPE_TYPE) || (this->scope->type == SCOPE_NAMESPACE)) {
      pSVar1 = this->globalScope;
      uVar3 = function->nameHash;
      IdentifierLookupResult::IdentifierLookupResult(&local_28,function);
      DirectChainedMap<IdentifierLookupResult>::remove(&pSVar1->idLookupMap,(char *)(ulong)uVar3);
    }
    else {
      pSVar1 = this->scope;
      uVar3 = function->nameHash;
      IdentifierLookupResult::IdentifierLookupResult
                ((IdentifierLookupResult *)&scopeFunctions,function);
      DirectChainedMap<IdentifierLookupResult>::remove(&pSVar1->idLookupMap,(char *)(ulong)uVar3);
    }
  }
  this_00 = &local_18->scope->functions;
  for (local_44 = 0; uVar3 = SmallArray<FunctionData_*,_2U>::size(this_00), local_44 < uVar3;
      local_44 = local_44 + 1) {
    ppFVar4 = SmallArray<FunctionData_*,_2U>::operator[](this_00,local_44);
    if (*ppFVar4 == local_18) {
      ppFVar4 = SmallArray<FunctionData_*,_2U>::back(this_00);
      pFVar2 = *ppFVar4;
      ppFVar4 = SmallArray<FunctionData_*,_2U>::operator[](this_00,local_44);
      *ppFVar4 = pFVar2;
      SmallArray<FunctionData_*,_2U>::pop_back(this_00);
    }
  }
  return;
}

Assistant:

void ExpressionContext::HideFunction(FunctionData *function)
{
	// Don't have to remove internal functions since they are never added to lookup
	if(function->name->name.begin && *function->name->name.begin != '$')
	{
		if(scope->type == SCOPE_TYPE || scope->type == SCOPE_NAMESPACE)
			globalScope->idLookupMap.remove(function->nameHash, IdentifierLookupResult(function));
		else
			scope->idLookupMap.remove(function->nameHash, IdentifierLookupResult(function));
	}

	SmallArray<FunctionData*, 2> &scopeFunctions = function->scope->functions;

	for(unsigned i = 0; i < scopeFunctions.size(); i++)
	{
		if(scopeFunctions[i] == function)
		{
			scopeFunctions[i] = scopeFunctions.back();
			scopeFunctions.pop_back();
		}
	}
}